

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O1

void __thiscall
chrono::ChFrame<double>::TransformParentToLocal
          (ChFrame<double> *this,ChFrame<double> *parent,ChFrame<double> *local)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChQuaternion<double> q;
  ChVector<double> local_60;
  ChQuaternion<double> local_48;
  
  ChTransform<double>::TransformParentToLocal
            (&(parent->coord).pos,&(this->coord).pos,&this->Amatrix);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->coord).rot.m_data[0];
  dVar1 = (this->coord).rot.m_data[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  dVar2 = (this->coord).rot.m_data[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2;
  dVar3 = (this->coord).rot.m_data[3];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar3;
  dVar4 = (parent->coord).rot.m_data[0];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar4;
  dVar5 = (parent->coord).rot.m_data[1];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar5;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1 * dVar5;
  auVar11 = vfmadd231sd_fma(auVar13,auVar6,auVar11);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (parent->coord).rot.m_data[2];
  auVar11 = vfmadd231sd_fma(auVar11,auVar8,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (parent->coord).rot.m_data[3];
  auVar11 = vfmadd231sd_fma(auVar11,auVar9,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar4 * dVar1;
  auVar13 = vfmsub231sd_fma(auVar16,auVar6,auVar12);
  auVar13 = vfmadd231sd_fma(auVar13,auVar9,auVar14);
  auVar16 = vfnmadd231sd_fma(auVar13,auVar8,auVar15);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar4 * dVar2;
  auVar13 = vfmsub231sd_fma(auVar17,auVar6,auVar14);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar9,auVar12);
  auVar13 = vfmadd231sd_fma(auVar13,auVar7,auVar15);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar4 * dVar3;
  auVar6 = vfmsub231sd_fma(auVar10,auVar6,auVar15);
  auVar6 = vfmadd231sd_fma(auVar6,auVar8,auVar12);
  auVar6 = vfnmadd231sd_fma(auVar6,auVar7,auVar14);
  local_48.m_data[0] = auVar11._0_8_;
  local_48.m_data[1] = auVar16._0_8_;
  local_48.m_data[2] = auVar13._0_8_;
  local_48.m_data[3] = auVar6._0_8_;
  SetCoord(local,&local_60,&local_48);
  return;
}

Assistant:

void TransformParentToLocal(
        const ChFrame<Real>& parent,  ///< frame to transform, given in parent coordinates
        ChFrame<Real>& local          ///< transformed frame, in local coordinates, will be stored here
        ) const {
        local.SetCoord(TransformParentToLocal(parent.coord.pos), coord.rot.GetConjugate() % parent.coord.rot);
    }